

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.h
# Opt level: O0

Flag<AutoArgParse::ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::ExclusiveWrapper<AutoArgParse::DoNothingTrigger>_>
* __thiscall
AutoArgParse::ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::
add<AutoArgParse::Flag,AutoArgParse::DoNothingTrigger>
          (ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *this,string *flag,string *description
          ,DoNothingTrigger *trigger)

{
  Policy policy;
  ComplexFlag<AutoArgParse::DoNothingTrigger> *this_00;
  reference __x;
  size_type sVar1;
  ExclusiveWrapper<AutoArgParse::DoNothingTrigger> local_40;
  type local_30;
  Flag<AutoArgParse::ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::ExclusiveWrapper<AutoArgParse::DoNothingTrigger>_>
  *flagObj;
  DoNothingTrigger *trigger_local;
  string *description_local;
  string *flag_local;
  ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger> *this_local;
  
  this_00 = this->parentFlag;
  policy = (this->super_FlagBase).super_ParseToken.policy;
  flagObj = (Flag<AutoArgParse::ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::ExclusiveWrapper<AutoArgParse::DoNothingTrigger>_>
             *)trigger;
  trigger_local = (DoNothingTrigger *)description;
  description_local = flag;
  flag_local = (string *)this;
  ExclusiveWrapper<AutoArgParse::DoNothingTrigger>::ExclusiveWrapper(&local_40,this,trigger);
  local_30 = ComplexFlag<AutoArgParse::DoNothingTrigger>::
             add<AutoArgParse::Flag,AutoArgParse::ExclusiveFlagGroup<AutoArgParse::DoNothingTrigger>::ExclusiveWrapper<AutoArgParse::DoNothingTrigger>>
                       (this_00,flag,policy,description,&local_40);
  __x = std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back(&(this->parentFlag->store).flagInsertionOrder);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->flags,__x);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&(this->parentFlag->store).flagInsertionOrder);
  sVar1 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->flags);
  if (1 < sVar1) {
    if ((this->super_FlagBase).super_ParseToken.policy == MANDATORY) {
      (this->parentFlag->store)._numberMandatoryFlags =
           (this->parentFlag->store)._numberMandatoryFlags + -1;
    }
    else {
      (this->parentFlag->store)._numberOptionalFlags =
           (this->parentFlag->store)._numberOptionalFlags + -1;
    }
  }
  return local_30;
}

Assistant:

FlagType<ExclusiveWrapper<OnParseTriggerType>>& add(
        const std::string& flag, const std::string& description,
        OnParseTriggerType&& trigger = DoNothingTrigger()) {
        typedef ExclusiveWrapper<OnParseTriggerType> ExclusiveEnforcer;
        auto& flagObj = parentFlag.template add<FlagType>(
            flag, policy, description,
            ExclusiveEnforcer(this, std::forward<OnParseTriggerType>(trigger)));
        flags.push_back(std::move(parentFlag.store.flagInsertionOrder.back()));
        parentFlag.store.flagInsertionOrder.pop_back();
        if (flags.size() > 1) {
            if (policy == Policy::MANDATORY) {
                --parentFlag.store._numberMandatoryFlags;
            } else {
                --parentFlag.store._numberOptionalFlags;
            }
        }
        return flagObj;
    }